

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode auth_create_digest_http_message
                   (Curl_easy *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen,
                   _func_void_uchar_ptr_uchar_ptr *convert_to_ascii,
                   _func_CURLcode_uchar_ptr_uchar_ptr_size_t *hash)

{
  CURLcode CVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 uVar7;
  char **local_320;
  char *local_2b8;
  char *local_290;
  char *opaque_quoted;
  char *hashthis2;
  char hashed [65];
  uchar local_218 [8];
  char cnoncebuf [33];
  char *tmp;
  char *hashthis;
  char *response;
  char *nonce_quoted;
  char *realm_quoted;
  char *userp_quoted;
  size_t cnonce_sz;
  char *cnonce;
  char userh [65];
  uchar local_158 [8];
  uchar ha2 [65];
  uchar local_108 [8];
  uchar ha1 [65];
  uchar local_b8 [8];
  uchar request_digest [65];
  uchar local_68 [8];
  uchar hashbuf [32];
  CURLcode result;
  digestdata *digest_local;
  uchar *uripath_local;
  uchar *request_local;
  char *passwdp_local;
  char *userp_local;
  Curl_easy *data_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  cnonce_sz = 0;
  userp_quoted = (char *)0x0;
  if (digest->nc == 0) {
    digest->nc = 1;
  }
  if (digest->cnonce == (char *)0x0) {
    hashbuf._28_4_ = Curl_rand_hex(data,local_218,0x21);
    if (hashbuf._28_4_ != CURLE_OK) {
      return hashbuf._28_4_;
    }
    sVar3 = strlen((char *)local_218);
    CVar1 = Curl_base64_encode((char *)local_218,sVar3,(char **)&cnonce_sz,(size_t *)&userp_quoted);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    digest->cnonce = (char *)cnonce_sz;
    hashbuf[0x1c] = '\0';
    hashbuf[0x1d] = '\0';
    hashbuf[0x1e] = '\0';
    hashbuf[0x1f] = '\0';
  }
  if (((byte)digest->field_0x35 >> 1 & 1) != 0) {
    if (digest->realm == (char *)0x0) {
      local_290 = "";
    }
    else {
      local_290 = digest->realm;
    }
    puVar4 = (uchar *)curl_maprintf("%s:%s",userp,local_290);
    if (puVar4 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    sVar3 = strlen((char *)puVar4);
    (*hash)(local_68,puVar4,sVar3);
    (*Curl_cfree)(puVar4);
    (*convert_to_ascii)(local_68,(uchar *)&cnonce);
  }
  if (digest->realm == (char *)0x0) {
    local_2b8 = "";
  }
  else {
    local_2b8 = digest->realm;
  }
  puVar4 = (uchar *)curl_maprintf("%s:%s:%s",userp,local_2b8,passwdp);
  if (puVar4 == (uchar *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar3 = strlen((char *)puVar4);
    (*hash)(local_68,puVar4,sVar3);
    (*Curl_cfree)(puVar4);
    (*convert_to_ascii)(local_68,local_108);
    if ((digest->algo & 1) != 0) {
      puVar4 = (uchar *)curl_maprintf("%s:%s:%s",local_108,digest->nonce,digest->cnonce);
      if (puVar4 == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      sVar3 = strlen((char *)puVar4);
      (*hash)(local_68,puVar4,sVar3);
      (*Curl_cfree)(puVar4);
      (*convert_to_ascii)(local_68,local_108);
    }
    pcVar5 = curl_maprintf("%s:%s",request,uripath);
    if (pcVar5 == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      tmp = pcVar5;
      if ((digest->qop != (char *)0x0) &&
         (iVar2 = Curl_strcasecompare(digest->qop,"auth-int"), iVar2 != 0)) {
        (*hash)(local_68,"",0);
        (*convert_to_ascii)(local_68,(uchar *)&hashthis2);
        tmp = curl_maprintf("%s:%s",pcVar5,&hashthis2);
        (*Curl_cfree)(pcVar5);
      }
      if (tmp == (char *)0x0) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        sVar3 = strlen(tmp);
        (*hash)(local_68,(uchar *)tmp,sVar3);
        (*Curl_cfree)(tmp);
        (*convert_to_ascii)(local_68,local_158);
        if (digest->qop == (char *)0x0) {
          tmp = curl_maprintf("%s:%s:%s",local_108,digest->nonce,local_158);
        }
        else {
          puVar4 = local_158;
          tmp = curl_maprintf("%s:%s:%08x:%s:%s:%s",local_108,digest->nonce,(ulong)(uint)digest->nc,
                              digest->cnonce,digest->qop,puVar4);
          uVar7 = (undefined4)((ulong)puVar4 >> 0x20);
        }
        if (tmp == (char *)0x0) {
          data_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          sVar3 = strlen(tmp);
          (*hash)(local_68,(uchar *)tmp,sVar3);
          (*Curl_cfree)(tmp);
          (*convert_to_ascii)(local_68,local_b8);
          local_320 = (char **)userp;
          if (((byte)digest->field_0x35 >> 1 & 1) != 0) {
            local_320 = &cnonce;
          }
          pcVar5 = auth_digest_string_quoted((char *)local_320);
          if (pcVar5 == (char *)0x0) {
            data_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            if (digest->realm == (char *)0x0) {
              nonce_quoted = (char *)(*Curl_cmalloc)(1);
              if (nonce_quoted != (char *)0x0) {
                *nonce_quoted = '\0';
              }
            }
            else {
              nonce_quoted = auth_digest_string_quoted(digest->realm);
            }
            if (nonce_quoted == (char *)0x0) {
              (*Curl_cfree)(pcVar5);
              data_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              pcVar6 = auth_digest_string_quoted(digest->nonce);
              if (pcVar6 == (char *)0x0) {
                (*Curl_cfree)(nonce_quoted);
                (*Curl_cfree)(pcVar5);
                data_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                if (digest->qop == (char *)0x0) {
                  hashthis = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", response=\"%s\""
                                           ,pcVar5,nonce_quoted,pcVar6,uripath,local_b8);
                }
                else {
                  hashthis = curl_maprintf("username=\"%s\", realm=\"%s\", nonce=\"%s\", uri=\"%s\", cnonce=\"%s\", nc=%08x, qop=%s, response=\"%s\""
                                           ,pcVar5,nonce_quoted,pcVar6,uripath,digest->cnonce,
                                           CONCAT44(uVar7,digest->nc),digest->qop,local_b8);
                  digest->nc = digest->nc + 1;
                }
                (*Curl_cfree)(pcVar6);
                (*Curl_cfree)(nonce_quoted);
                (*Curl_cfree)(pcVar5);
                if (hashthis == (char *)0x0) {
                  data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                }
                else {
                  if (digest->opaque != (char *)0x0) {
                    pcVar5 = auth_digest_string_quoted(digest->opaque);
                    if (pcVar5 == (char *)0x0) {
                      (*Curl_cfree)(hashthis);
                      return CURLE_OUT_OF_MEMORY;
                    }
                    pcVar6 = curl_maprintf("%s, opaque=\"%s\"",hashthis,pcVar5);
                    (*Curl_cfree)(hashthis);
                    (*Curl_cfree)(pcVar5);
                    hashthis = pcVar6;
                    if (pcVar6 == (char *)0x0) {
                      return CURLE_OUT_OF_MEMORY;
                    }
                  }
                  if (digest->algorithm != (char *)0x0) {
                    pcVar5 = curl_maprintf("%s, algorithm=%s",hashthis,digest->algorithm);
                    (*Curl_cfree)(hashthis);
                    hashthis = pcVar5;
                    if (pcVar5 == (char *)0x0) {
                      return CURLE_OUT_OF_MEMORY;
                    }
                  }
                  if (((byte)digest->field_0x35 >> 1 & 1) != 0) {
                    pcVar5 = curl_maprintf("%s, userhash=true",hashthis);
                    (*Curl_cfree)(hashthis);
                    hashthis = pcVar5;
                    if (pcVar5 == (char *)0x0) {
                      return CURLE_OUT_OF_MEMORY;
                    }
                  }
                  *outptr = hashthis;
                  sVar3 = strlen(hashthis);
                  *outlen = sVar3;
                  data_local._4_4_ = CURLE_OK;
                }
              }
            }
          }
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode auth_create_digest_http_message(
                  struct Curl_easy *data,
                  const char *userp,
                  const char *passwdp,
                  const unsigned char *request,
                  const unsigned char *uripath,
                  struct digestdata *digest,
                  char **outptr, size_t *outlen,
                  void (*convert_to_ascii)(unsigned char *, unsigned char *),
                  CURLcode (*hash)(unsigned char *, const unsigned char *,
                                   const size_t))
{
  CURLcode result;
  unsigned char hashbuf[32]; /* 32 bytes/256 bits */
  unsigned char request_digest[65];
  unsigned char ha1[65];    /* 64 digits and 1 zero byte */
  unsigned char ha2[65];    /* 64 digits and 1 zero byte */
  char userh[65];
  char *cnonce = NULL;
  size_t cnonce_sz = 0;
  char *userp_quoted;
  char *realm_quoted;
  char *nonce_quoted;
  char *response = NULL;
  char *hashthis = NULL;
  char *tmp = NULL;

  if(!digest->nc)
    digest->nc = 1;

  if(!digest->cnonce) {
    char cnoncebuf[33];
    result = Curl_rand_hex(data, (unsigned char *)cnoncebuf,
                           sizeof(cnoncebuf));
    if(result)
      return result;

    result = Curl_base64_encode(cnoncebuf, strlen(cnoncebuf),
                                &cnonce, &cnonce_sz);
    if(result)
      return result;

    digest->cnonce = cnonce;
  }

  if(digest->userhash) {
    hashthis = aprintf("%s:%s", userp, digest->realm ? digest->realm : "");
    if(!hashthis)
      return CURLE_OUT_OF_MEMORY;

    hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
    free(hashthis);
    convert_to_ascii(hashbuf, (unsigned char *)userh);
  }

  /*
    If the algorithm is "MD5" or unspecified (which then defaults to MD5):

      A1 = unq(username-value) ":" unq(realm-value) ":" passwd

    If the algorithm is "MD5-sess" then:

      A1 = H(unq(username-value) ":" unq(realm-value) ":" passwd) ":"
           unq(nonce-value) ":" unq(cnonce-value)
  */

  hashthis = aprintf("%s:%s:%s", userp, digest->realm ? digest->realm : "",
                     passwdp);
  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
  free(hashthis);
  convert_to_ascii(hashbuf, ha1);

  if(digest->algo & SESSION_ALGO) {
    /* nonce and cnonce are OUTSIDE the hash */
    tmp = aprintf("%s:%s:%s", ha1, digest->nonce, digest->cnonce);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    hash(hashbuf, (unsigned char *) tmp, strlen(tmp));
    free(tmp);
    convert_to_ascii(hashbuf, ha1);
  }

  /*
    If the "qop" directive's value is "auth" or is unspecified, then A2 is:

      A2 = Method ":" digest-uri-value

    If the "qop" value is "auth-int", then A2 is:

      A2 = Method ":" digest-uri-value ":" H(entity-body)

    (The "Method" value is the HTTP request method as specified in section
    5.1.1 of RFC 2616)
  */

  hashthis = aprintf("%s:%s", request, uripath);
  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  if(digest->qop && strcasecompare(digest->qop, "auth-int")) {
    /* We don't support auth-int for PUT or POST */
    char hashed[65];
    char *hashthis2;

    hash(hashbuf, (const unsigned char *)"", 0);
    convert_to_ascii(hashbuf, (unsigned char *)hashed);

    hashthis2 = aprintf("%s:%s", hashthis, hashed);
    free(hashthis);
    hashthis = hashthis2;
  }

  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
  free(hashthis);
  convert_to_ascii(hashbuf, ha2);

  if(digest->qop) {
    hashthis = aprintf("%s:%s:%08x:%s:%s:%s", ha1, digest->nonce, digest->nc,
                       digest->cnonce, digest->qop, ha2);
  }
  else {
    hashthis = aprintf("%s:%s:%s", ha1, digest->nonce, ha2);
  }

  if(!hashthis)
    return CURLE_OUT_OF_MEMORY;

  hash(hashbuf, (unsigned char *) hashthis, strlen(hashthis));
  free(hashthis);
  convert_to_ascii(hashbuf, request_digest);

  /* For test case 64 (snooped from a Mozilla 1.3a request)

     Authorization: Digest username="testuser", realm="testrealm", \
     nonce="1053604145", uri="/64", response="c55f7f30d83d774a3d2dcacf725abaca"

     Digest parameters are all quoted strings.  Username which is provided by
     the user will need double quotes and backslashes within it escaped.
     realm, nonce, and opaque will need backslashes as well as they were
     de-escaped when copied from request header.  cnonce is generated with
     web-safe characters.  uri is already percent encoded.  nc is 8 hex
     characters.  algorithm and qop with standard values only contain web-safe
     characters.
  */
  userp_quoted = auth_digest_string_quoted(digest->userhash ? userh : userp);
  if(!userp_quoted)
    return CURLE_OUT_OF_MEMORY;
  if(digest->realm)
    realm_quoted = auth_digest_string_quoted(digest->realm);
  else {
    realm_quoted = malloc(1);
    if(realm_quoted)
      realm_quoted[0] = 0;
  }
  if(!realm_quoted) {
    free(userp_quoted);
    return CURLE_OUT_OF_MEMORY;
  }
  nonce_quoted = auth_digest_string_quoted(digest->nonce);
  if(!nonce_quoted) {
    free(realm_quoted);
    free(userp_quoted);
    return CURLE_OUT_OF_MEMORY;
  }

  if(digest->qop) {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "cnonce=\"%s\", "
                       "nc=%08x, "
                       "qop=%s, "
                       "response=\"%s\"",
                       userp_quoted,
                       realm_quoted,
                       nonce_quoted,
                       uripath,
                       digest->cnonce,
                       digest->nc,
                       digest->qop,
                       request_digest);

    /* Increment nonce-count to use another nc value for the next request */
    digest->nc++;
  }
  else {
    response = aprintf("username=\"%s\", "
                       "realm=\"%s\", "
                       "nonce=\"%s\", "
                       "uri=\"%s\", "
                       "response=\"%s\"",
                       userp_quoted,
                       realm_quoted,
                       nonce_quoted,
                       uripath,
                       request_digest);
  }
  free(nonce_quoted);
  free(realm_quoted);
  free(userp_quoted);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Add the optional fields */
  if(digest->opaque) {
    char *opaque_quoted;
    /* Append the opaque */
    opaque_quoted = auth_digest_string_quoted(digest->opaque);
    if(!opaque_quoted) {
      free(response);
      return CURLE_OUT_OF_MEMORY;
    }
    tmp = aprintf("%s, opaque=\"%s\"", response, opaque_quoted);
    free(response);
    free(opaque_quoted);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->algorithm) {
    /* Append the algorithm */
    tmp = aprintf("%s, algorithm=%s", response, digest->algorithm);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  if(digest->userhash) {
    /* Append the userhash */
    tmp = aprintf("%s, userhash=true", response);
    free(response);
    if(!tmp)
      return CURLE_OUT_OF_MEMORY;

    response = tmp;
  }

  /* Return the output */
  *outptr = response;
  *outlen = strlen(response);

  return CURLE_OK;
}